

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O3

uint lsvm::system::sleep(uint __seconds)

{
  uint uVar1;
  timespec t;
  timespec local_10;
  
  local_10.tv_sec = (ulong)__seconds / 1000;
  local_10.tv_nsec = (long)((__seconds % 1000) * 1000000);
  uVar1 = nanosleep(&local_10,(timespec *)0x0);
  return uVar1;
}

Assistant:

void sleep(uint32_t millis){
#if _POSIX_C_SOURCE >= 199309L
    struct timespec t;
    t.tv_sec = millis / 1000;
    t.tv_nsec = (millis % 1000) * 1000000;
    nanosleep(&t, NULL);
#else
    usleep(milliseconds * 1000);
#endif
}